

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_RandomRHSInNonlinear_Test::TestBody(SPTest_RandomRHSInNonlinear_Test *this)

{
  ExprBase this_00;
  Reference RVar1;
  ColumnSizeHandler this_01;
  ColProblem *gmock_a1;
  int iVar2;
  int iVar3;
  MutAlgebraicCon MVar4;
  LinearConHandler LVar5;
  MockScenarioHandler handler;
  SPAdapter sp;
  ColumnSizeHandler cols;
  TestProblem p;
  NLHeader header;
  TestProblem *in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6f0;
  type_conflict1 in_stack_fffffffffffff6f4;
  MutAlgebraicCon *in_stack_fffffffffffff6f8;
  int con_index;
  ExprBase in_stack_fffffffffffff700;
  NLHeader *in_stack_fffffffffffff708;
  int var_index;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  int value;
  Matcher<int> *this_02;
  undefined1 *value_00;
  TestProblem *in_stack_fffffffffffff738;
  double in_stack_fffffffffffff7a0;
  double in_stack_fffffffffffff7a8;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7e0;
  char *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7f4;
  char *in_stack_fffffffffffff7f8;
  MockSpec<void_(int,_double)> *in_stack_fffffffffffff800;
  ColProblem *in_stack_fffffffffffff848;
  SPAdapter *in_stack_fffffffffffff850;
  int in_stack_fffffffffffff85c;
  SPAdapter *in_stack_fffffffffffff860;
  undefined1 local_4c8 [944];
  Matcher<int> local_118 [5];
  undefined8 local_a0;
  
  this_02 = local_118;
  MakeHeader(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0);
  local_a0 = 1;
  value_00 = local_4c8;
  TestProblem::TestProblem
            ((TestProblem *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             in_stack_fffffffffffff708);
  this_00.impl_ = (Impl *)TestProblem::MakeTestRV(in_stack_fffffffffffff738);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  value = MVar4.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_;
  iVar2 = MVar4.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  RVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                    ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffff6e8,0);
  var_index = RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_
  ;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff6f8,
             (Reference)in_stack_fffffffffffff700.impl_,in_stack_fffffffffffff6f4);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            (in_stack_fffffffffffff6f8,(NumericExpr)in_stack_fffffffffffff700.impl_);
  con_index = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  this_01 = TestProblem::OnColumnSizes(in_stack_fffffffffffff6e8);
  iVar3 = (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
             iVar3);
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
             iVar3);
  LVar5 = TestProblem::OnLinearConExpr((TestProblem *)this_01.problem_,con_index);
  gmock_a1 = LVar5.problem_;
  iVar3 = LVar5.con_index_;
  mp::ColProblemBuilder::LinearConHandler::AddTerm
            ((LinearConHandler *)CONCAT44(iVar2,in_stack_fffffffffffff710),var_index,
             (double)this_01.problem_);
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  MockScenarioHandler::MockScenarioHandler((MockScenarioHandler *)this_01.problem_);
  testing::Matcher<int>::Matcher(this_02,value);
  testing::Matcher<double>::Matcher((Matcher<double> *)this_00.impl_,(double)value_00);
  MockScenarioHandler::gmock_OnRHS
            ((MockScenarioHandler *)this_01.problem_,(Matcher<int> *)gmock_a1,
             (Matcher<double> *)CONCAT44(iVar3,in_stack_fffffffffffff6f0));
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x123b53);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x123b5d);
  mp::SPAdapter::GetScenario<MockScenarioHandler>
            (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,
             (MockScenarioHandler *)in_stack_fffffffffffff850);
  MockScenarioHandler::~MockScenarioHandler
            ((MockScenarioHandler *)CONCAT44(iVar3,in_stack_fffffffffffff6f0));
  mp::SPAdapter::~SPAdapter((SPAdapter *)CONCAT44(iVar3,in_stack_fffffffffffff6f0));
  TestProblem::~TestProblem((TestProblem *)CONCAT44(iVar3,in_stack_fffffffffffff6f0));
  return;
}

Assistant:

TEST(SPTest, RandomRHSInNonlinear) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0).set_nonlinear_expr(p.MakeVariable(0));
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, -3);
  mp::SPAdapter sp(p);
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, 44));
  sp.GetScenario(0, handler);
}